

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

int gc_mayclear(cTValue *o,int val)

{
  int val_local;
  cTValue *o_local;
  
  if (0xfffffff6 < ((int)(o->field_4).it >> 0xf) + 4U) {
    if ((int)(o->field_4).it >> 0xf == -5) {
      *(byte *)((o->u64 & 0x7fffffffffff) + 8) = *(byte *)((o->u64 & 0x7fffffffffff) + 8) & 0xfc;
      return 0;
    }
    if ((*(byte *)((o->u64 & 0x7fffffffffff) + 8) & 3) != 0) {
      return 1;
    }
    if ((((int)(o->field_4).it >> 0xf == -0xd) && (val != 0)) &&
       ((*(byte *)((o->u64 & 0x7fffffffffff) + 8) & 8) != 0)) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int gc_mayclear(cTValue *o, int val)
{
  if (tvisgcv(o)) {  /* Only collectable objects can be weak references. */
    if (tvisstr(o)) {  /* But strings cannot be used as weak references. */
      gc_mark_str(strV(o));  /* And need to be marked. */
      return 0;
    }
    if (iswhite(gcV(o)))
      return 1;  /* Object is about to be collected. */
    if (tvisudata(o) && val && isfinalized(udataV(o)))
      return 1;  /* Finalized userdata is dropped only from values. */
  }
  return 0;  /* Cannot clear. */
}